

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

word Abc_Tt6Stretch(word t,int nVars)

{
  int local_14;
  word wStack_10;
  int nVars_local;
  word t_local;
  
  if (nVars < 0) {
    __assert_fail("nVars >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                  ,0x30d,"word Abc_Tt6Stretch(word, int)");
  }
  local_14 = nVars;
  wStack_10 = t;
  if (nVars == 0) {
    local_14 = 1;
    wStack_10 = t & 1 | (t & 1) << 1;
  }
  if (local_14 == 1) {
    local_14 = 2;
    wStack_10 = wStack_10 & 3 | (wStack_10 & 3) << 2;
  }
  if (local_14 == 2) {
    local_14 = 3;
    wStack_10 = wStack_10 & 0xf | (wStack_10 & 0xf) << 4;
  }
  if (local_14 == 3) {
    local_14 = 4;
    wStack_10 = wStack_10 & 0xff | (wStack_10 & 0xff) << 8;
  }
  if (local_14 == 4) {
    local_14 = 5;
    wStack_10 = wStack_10 & 0xffff | (wStack_10 & 0xffff) << 0x10;
  }
  if (local_14 == 5) {
    local_14 = 6;
    wStack_10 = wStack_10 & 0xffffffff | wStack_10 << 0x20;
  }
  if (local_14 == 6) {
    return wStack_10;
  }
  __assert_fail("nVars == 6",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                ,0x31a,"word Abc_Tt6Stretch(word, int)");
}

Assistant:

static inline word Abc_Tt6Stretch( word t, int nVars )
{
    assert( nVars >= 0 );
    if ( nVars == 0 )
        nVars++, t = (t & 0x1) | ((t & 0x1) << 1);
    if ( nVars == 1 )
        nVars++, t = (t & 0x3) | ((t & 0x3) << 2);
    if ( nVars == 2 )
        nVars++, t = (t & 0xF) | ((t & 0xF) << 4);
    if ( nVars == 3 )
        nVars++, t = (t & 0xFF) | ((t & 0xFF) << 8);
    if ( nVars == 4 )
        nVars++, t = (t & 0xFFFF) | ((t & 0xFFFF) << 16);
    if ( nVars == 5 )
        nVars++, t = (t & 0xFFFFFFFF) | ((t & 0xFFFFFFFF) << 32);
    assert( nVars == 6 );
    return t;
}